

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChTriangleMeshConnected.cpp
# Opt level: O2

void __thiscall
chrono::geometry::ChTriangleMeshConnected::RefineMeshEdges
          (ChTriangleMeshConnected *this,vector<int,_std::allocator<int>_> *marked_tris,
          double edge_maxlen,ChRefineEdgeCriterion *criterion,
          vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *atri_map,
          vector<std::vector<double,_std::allocator<double>_>_*,_std::allocator<std::vector<double,_std::allocator<double>_>_*>_>
          *aux_data_double,
          vector<std::vector<int,_std::allocator<int>_>_*,_std::allocator<std::vector<int,_std::allocator<int>_>_*>_>
          *aux_data_int,
          vector<std::vector<bool,_std::allocator<bool>_>_*,_std::allocator<std::vector<bool,_std::allocator<bool>_>_*>_>
          *aux_data_bool,
          vector<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>_*,_std::allocator<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>_*>_>
          *aux_data_vect)

{
  int itA;
  int *piVar1;
  pointer pCVar2;
  pair<int,_int> pVar3;
  ChException *this_00;
  _List_node_base *p_Var4;
  int iVar5;
  long lVar6;
  ChTriangleMeshConnected *this_01;
  int *piVar8;
  ulong __n;
  double dVar9;
  pointer pCVar10;
  reference rVar11;
  int t_N1;
  int local_150;
  int itA_2;
  double local_148;
  int local_13c;
  int itB_2;
  int itB_1;
  list<int,_std::allocator<int>_> mlist;
  int t_0;
  ChVector<double> v;
  vector<bool,_std::allocator<bool>_> marked_tris_flagged;
  vector<int,_std::allocator<int>_> new_marked_tris;
  vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> tmp_tri_map;
  pointer local_80;
  list<int,_std::allocator<int>_> S;
  string local_50;
  long lVar7;
  
  std::__cxx11::list<int,std::allocator<int>>::
  list<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
            ((list<int,std::allocator<int>> *)&S,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             (marked_tris->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             (marked_tris->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish,(allocator_type *)&marked_tris_flagged);
  tmp_tri_map.super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  tmp_tri_map.super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  tmp_tri_map.super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (atri_map == (vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *)0x0) {
    ComputeNeighbouringTriangleMap(this,&tmp_tri_map);
  }
  else {
    std::vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>::operator=
              (&tmp_tri_map,atri_map);
  }
  marked_tris_flagged.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  marked_tris_flagged.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_offset = 0;
  marked_tris_flagged.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  marked_tris_flagged.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_offset = 0;
  marked_tris_flagged.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  std::vector<bool,_std::allocator<bool>_>::resize
            (&marked_tris_flagged,
             ((long)(this->m_face_v_indices).
                    super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->m_face_v_indices).
                   super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>
                   ._M_impl.super__Vector_impl_data._M_start) / 0xc,false);
  piVar1 = (marked_tris->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (piVar8 = (marked_tris->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start; piVar8 != piVar1; piVar8 = piVar8 + 1) {
    rVar11 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       (&marked_tris_flagged,(long)*piVar8);
    *rVar11._M_p = *rVar11._M_p | rVar11._M_mask;
  }
  new_marked_tris.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  new_marked_tris.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  new_marked_tris.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  p_Var4 = (_List_node_base *)&S;
  do {
    p_Var4 = (((_List_base<int,_std::allocator<int>_> *)&p_Var4->_M_next)->_M_impl)._M_node.
             super__List_node_base._M_next;
    if (p_Var4 == (_List_node_base *)&S) {
      std::vector<int,_std::allocator<int>_>::operator=(marked_tris,&new_marked_tris);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&new_marked_tris.super__Vector_base<int,_std::allocator<int>_>);
      std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
                (&marked_tris_flagged.super__Bvector_base<std::allocator<bool>_>);
      std::_Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>::~_Vector_base
                (&tmp_tri_map.
                  super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>);
      std::__cxx11::_List_base<int,_std::allocator<int>_>::_M_clear
                (&S.super__List_base<int,_std::allocator<int>_>);
      return;
    }
    this_01 = (ChTriangleMeshConnected *)&mlist;
    t_0 = *(int *)&p_Var4[1]._M_next;
    mlist.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size = 0;
    mlist.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.super__List_node_base._M_next
         = (_List_node_base *)this_01;
    mlist.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.super__List_node_base._M_prev
         = (_List_node_base *)this_01;
    std::__cxx11::list<int,_std::allocator<int>_>::push_back
              ((list<int,_std::allocator<int>_> *)this_01,&t_0);
LAB_00d5b236:
    if (mlist.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.super__List_node_base.
        _M_next != (_List_node_base *)&mlist) {
      local_150 = 0;
      local_148 = 0.0;
      itA = *(int *)&mlist.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
                     super__List_node_base._M_prev[1]._M_next;
      __n = (ulong)itA;
      t_N1 = 0;
      lVar6 = 0;
      while (lVar7 = lVar6, lVar6 = lVar7 + 1, lVar6 != 4) {
        pVar3 = GetTriangleEdgeIndexes
                          (this_01,(this->m_face_v_indices).
                                   super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + __n,(int)lVar7,true);
        if (criterion == (ChRefineEdgeCriterion *)0x0) {
          pCVar2 = (this->m_vertices).
                   super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          v.m_data._0_16_ =
               vsubpd_avx(*(undefined1 (*) [16])pCVar2[pVar3.first].m_data,
                          *(undefined1 (*) [16])pCVar2[(long)pVar3 >> 0x20].m_data);
          v.m_data[2] = pCVar2[pVar3.first].m_data[2] - pCVar2[(long)pVar3 >> 0x20].m_data[2];
          this_01 = (ChTriangleMeshConnected *)&v;
          dVar9 = ChVector<double>::Length((ChVector<double> *)this_01);
        }
        else {
          this_01 = (ChTriangleMeshConnected *)criterion;
          dVar9 = (double)(**(code **)(*(long *)criterion + 0x10))
                                    (criterion,(ulong)pVar3 & 0xffffffff,(ulong)pVar3 >> 0x20,this);
        }
        if (local_148 < dVar9) {
          t_N1 = tmp_tri_map.
                 super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>.
                 _M_impl.super__Vector_impl_data._M_start[__n]._M_elems[lVar7 + 1];
          local_150 = (int)lVar7;
          local_148 = dVar9;
        }
      }
      if (edge_maxlen <= local_148) {
        this_01 = (ChTriangleMeshConnected *)&mlist;
        std::__cxx11::list<int,_std::allocator<int>_>::push_back
                  ((list<int,_std::allocator<int>_> *)this_01,&t_N1);
        if (1000 < mlist.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size) {
          this_00 = (ChException *)__cxa_allocate_exception(0x28);
          std::__cxx11::string::string
                    ((string *)&local_50,"overflow in ChTriangleMeshConnected::RefineMeshEdges",
                     (allocator *)&v);
          ChException::ChException(this_00,&local_50);
          __cxa_throw(this_00,&ChException::typeinfo,ChException::~ChException);
        }
        if (t_N1 != -1) break;
        if (edge_maxlen < local_148) {
          SplitEdge(this,itA,-1,local_150,0,(int *)&v,&itA_2,&itB_1,&itB_2,&tmp_tri_map,
                    aux_data_double,aux_data_int,aux_data_bool,aux_data_vect);
          if (__n < (ulong)marked_tris_flagged.super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
                    ((long)marked_tris_flagged.super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                    (long)marked_tris_flagged.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8) {
            rVar11 = std::vector<bool,_std::allocator<bool>_>::operator[](&marked_tris_flagged,__n);
            if ((*rVar11._M_p & rVar11._M_mask) != 0) {
              std::vector<int,_std::allocator<int>_>::push_back
                        (&new_marked_tris,(value_type_conflict2 *)&v);
              std::vector<int,_std::allocator<int>_>::push_back(&new_marked_tris,&itA_2);
            }
          }
        }
        goto LAB_00d5b603;
      }
      std::__cxx11::list<int,_std::allocator<int>_>::pop_back(&mlist);
    }
    std::__cxx11::_List_base<int,_std::allocator<int>_>::_M_clear
              (&mlist.super__List_base<int,_std::allocator<int>_>);
  } while( true );
  local_13c = 0;
  iVar5 = 0;
  local_80 = (pointer)0x0;
  lVar6 = 0;
  while (lVar7 = lVar6, lVar6 = lVar7 + 1, lVar6 != 4) {
    pVar3 = GetTriangleEdgeIndexes
                      (this_01,(this->m_face_v_indices).
                               super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + t_N1,(int)lVar7,true);
    if (criterion == (ChRefineEdgeCriterion *)0x0) {
      pCVar2 = (this->m_vertices).
               super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      v.m_data._0_16_ =
           vsubpd_avx(*(undefined1 (*) [16])pCVar2[pVar3.first].m_data,
                      *(undefined1 (*) [16])pCVar2[(long)pVar3 >> 0x20].m_data);
      v.m_data[2] = pCVar2[pVar3.first].m_data[2] - pCVar2[(long)pVar3 >> 0x20].m_data[2];
      this_01 = (ChTriangleMeshConnected *)&v;
      pCVar10 = (pointer)ChVector<double>::Length((ChVector<double> *)this_01);
    }
    else {
      this_01 = (ChTriangleMeshConnected *)criterion;
      pCVar10 = (pointer)(**(code **)(*(long *)criterion + 0x10))
                                   (criterion,(ulong)pVar3 & 0xffffffff,(ulong)pVar3 >> 0x20,this);
    }
    if ((double)local_80 < (double)pCVar10) {
      iVar5 = tmp_tri_map.
              super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>.
              _M_impl.super__Vector_impl_data._M_start[t_N1]._M_elems[lVar7 + 1];
      local_13c = (int)lVar7;
      local_80 = pCVar10;
    }
  }
  if (iVar5 == itA) {
    if (edge_maxlen < local_148) {
      SplitEdge(this,itA,t_N1,local_150,local_13c,(int *)&v,&itA_2,&itB_1,&itB_2,&tmp_tri_map,
                aux_data_double,aux_data_int,aux_data_bool,aux_data_vect);
      if (__n < (ulong)marked_tris_flagged.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
                ((long)marked_tris_flagged.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                (long)marked_tris_flagged.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8) {
        rVar11 = std::vector<bool,_std::allocator<bool>_>::operator[](&marked_tris_flagged,__n);
        if ((*rVar11._M_p & rVar11._M_mask) != 0) {
          std::vector<int,_std::allocator<int>_>::push_back
                    (&new_marked_tris,(value_type_conflict2 *)&v);
          std::vector<int,_std::allocator<int>_>::push_back(&new_marked_tris,&itA_2);
        }
      }
      if ((ulong)(long)t_N1 <
          (ulong)marked_tris_flagged.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
          ((long)marked_tris_flagged.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
          (long)marked_tris_flagged.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8) {
        rVar11 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           (&marked_tris_flagged,(long)t_N1);
        if ((*rVar11._M_p & rVar11._M_mask) != 0) {
          std::vector<int,_std::allocator<int>_>::push_back(&new_marked_tris,&itB_1);
          std::vector<int,_std::allocator<int>_>::push_back(&new_marked_tris,&itB_2);
        }
      }
    }
LAB_00d5b603:
    this_01 = (ChTriangleMeshConnected *)&mlist;
    std::__cxx11::list<int,_std::allocator<int>_>::pop_back
              ((list<int,_std::allocator<int>_> *)this_01);
    std::__cxx11::list<int,_std::allocator<int>_>::pop_back
              ((list<int,_std::allocator<int>_> *)this_01);
  }
  goto LAB_00d5b236;
}

Assistant:

void ChTriangleMeshConnected::RefineMeshEdges(
    std::vector<int>&
        marked_tris,     ///< triangles to refine (aso surrounding triangles might be affected by refinements)
    double edge_maxlen,  ///< maximum length of edge (small values give higher resolution)
    ChRefineEdgeCriterion* criterion,  ///< criterion for computing lenght (or other merit function) of edge, if =0 uses
                                       ///< default (euclidean length)
    std::vector<std::array<int, 4>>* atri_map,  ///< triangle connectivity map: use and modify it. Optional. If =0,
                                                ///< creates a temporary one just for life span of function.
    std::vector<std::vector<double>*>& aux_data_double,  ///< auxiliary buffers to refine (assuming indexed as vertexes:
                                                         ///< each with same size as vertex buffer)
    std::vector<std::vector<int>*>& aux_data_int,  ///< auxiliary buffers to refine (assuming indexed as vertexes: each
                                                   ///< with same size as vertex buffer)
    std::vector<std::vector<bool>*>& aux_data_bool,  ///< auxiliary buffers to refine (assuming indexed as vertexes:
                                                     ///< each with same size as vertex buffer)
    std::vector<std::vector<ChVector<>>*>& aux_data_vect  ///< auxiliary buffers to refine (assuming indexed as
                                                          ///< vertexes: each with same size as vertex buffer)
) {
    // initialize the list of triangles to refine, copying from marked triangles:
    std::list<int> S(marked_tris.begin(), marked_tris.end());

    // compute the connectivity map between triangles:
    std::vector<std::array<int, 4>> tmp_tri_map;
    std::vector<std::array<int, 4>>& tri_map = tmp_tri_map;
    if (atri_map) {
        tri_map = *atri_map;
    } else {
        this->ComputeNeighbouringTriangleMap(tri_map);
    }

    std::vector<bool> marked_tris_flagged;
    marked_tris_flagged.resize(this->m_face_v_indices.size());
    for (auto i : marked_tris)
        marked_tris_flagged[i] = true;

    std::vector<int> new_marked_tris;

    for (auto t_0 : S) {
        // Insert-lepp-points

        std::list<int> mlist;
        mlist.push_back(t_0);

        while (!mlist.empty()) {
            //  find last triangle in ordered list
            auto t_N = mlist.back();

            //  find longest-edge neighbour
            int t_N1 = 0;
            double L_max = 0;
            int edge_N = 0;
            double L_e;
            for (int ie = 0; ie < 3; ++ie) {
                std::pair<int, int> ie_verts = this->GetTriangleEdgeIndexes(m_face_v_indices[t_N], ie, true);
                if (criterion)
                    L_e = criterion->ComputeLength(ie_verts.first, ie_verts.second, this);
                else
                    L_e = (this->m_vertices[ie_verts.first] - this->m_vertices[ie_verts.second]).Length();
                if (L_e > L_max) {
                    L_max = L_e;
                    edge_N = ie;
                    t_N1 = tri_map[t_N][1 + ie];  // neighbour triangle
                }
            }

            if (L_max < edge_maxlen) {
                //  GetLog() << "  already small triangle - pop it and break while " << "\n";
                mlist.pop_back();
                break;
            }

            // add longest-edge neighbour to the list
            mlist.push_back(t_N1);

            if (mlist.size() > 1000)
                throw ChException("overflow in ChTriangleMeshConnected::RefineMeshEdges");

            // if boundary edge: always terminal edge
            if (t_N1 == -1) {
                // split triangle edge
                if (L_max > edge_maxlen) {
                    // do edge split
                    int itA_1, itA_2, itB_1, itB_2;
                    SplitEdge(t_N, -1, edge_N, 0, itA_1, itA_2, itB_1, itB_2, tri_map, aux_data_double, aux_data_int,
                              aux_data_bool, aux_data_vect);

                    // prepare list of original triangles after split, for the next iteration of bisection
                    if (t_N < marked_tris_flagged.size() && marked_tris_flagged[t_N] == true) {
                        new_marked_tris.push_back(itA_1);
                        new_marked_tris.push_back(itA_2);
                    }
                }

                // remove from list
                mlist.pop_back();
                mlist.pop_back();

            } else {
                //  find longest-edge in neighboring triangle
                double T1_L_max = 0;
                int edge_N1 = 0;
                int t_shared = 0;
                for (int ie = 0; ie < 3; ++ie) {
                    std::pair<int, int> T1_ie_verts = this->GetTriangleEdgeIndexes(m_face_v_indices[t_N1], ie, true);
                    if (criterion)
                        L_e = criterion->ComputeLength(T1_ie_verts.first, T1_ie_verts.second, this);
                    else
                        L_e = (this->m_vertices[T1_ie_verts.first] - this->m_vertices[T1_ie_verts.second]).Length();
                    if (L_e > T1_L_max) {
                        T1_L_max = L_e;
                        edge_N1 = ie;
                        t_shared = tri_map[t_N1][1 + ie];  // neighbour triangle
                    }
                }
                // shared terminal edge (it is the longest edge in both triangles)
                if (t_shared == t_N) {
                    // split triangle edge
                    if (L_max > edge_maxlen) {
                        // do edge split
                        int itA_1, itA_2, itB_1, itB_2;
                        SplitEdge(t_N, t_N1, edge_N, edge_N1, itA_1, itA_2, itB_1, itB_2, tri_map, aux_data_double,
                                  aux_data_int, aux_data_bool, aux_data_vect);

                        // prepare list of original triangles after split, for the next iteration of bisection
                        if (t_N < marked_tris_flagged.size() && marked_tris_flagged[t_N] == true) {
                            new_marked_tris.push_back(itA_1);
                            new_marked_tris.push_back(itA_2);
                        }
                        if (t_N1 < marked_tris_flagged.size() && marked_tris_flagged[t_N1] == true) {
                            new_marked_tris.push_back(itB_1);
                            new_marked_tris.push_back(itB_2);
                        }
                    }

                    // remove from list
                    mlist.pop_back();
                    mlist.pop_back();
                }
            }
        }
    }
    marked_tris = new_marked_tris;
}